

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

StructNew * __thiscall
wasm::Builder::makeStructNew(Builder *this,HeapType type,ExpressionList *args)

{
  size_t sVar1;
  StructNew *this_00;
  MixedArena *this_01;
  
  this_01 = &this->wasm->allocator;
  this_00 = (StructNew *)MixedArena::allocSpace(this_01,0x30,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression._id = StructNewId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type.id = 0;
  (this_00->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  data = (Expression **)0x0;
  (this_00->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (this_00->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (this_00->operands).allocator = this_01;
  if (&this_00->operands != args) {
    (this_00->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    data = (args->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data;
    (args->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data =
         (Expression **)0x0;
    (this_00->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    usedElements = (args->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                   ).usedElements;
    (args->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).usedElements
         = 0;
    sVar1 = (this_00->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
            allocatedElements;
    (this_00->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    allocatedElements =
         (args->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
         allocatedElements;
    (args->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
    allocatedElements = sVar1;
  }
  if (((uint)(0x7c < type.id) * 4 + 3 & (uint)type.id) == 0) {
    (this_00->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type.id = type.id
    ;
    StructNew::finalize(this_00);
    return this_00;
  }
  __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
}

Assistant:

StructNew* makeStructNew(HeapType type, ExpressionList&& args) {
    auto* ret = wasm.allocator.alloc<StructNew>();
    ret->operands = std::move(args);
    ret->type = Type(type, NonNullable);
    ret->finalize();
    return ret;
  }